

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

ssize_t __thiscall
Jupiter::IRC::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  pointer this_00;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  __sv_type local_30;
  Client *local_20;
  Client *this_local;
  string_view rawMessage_local;
  
  this_local = (Client *)CONCAT44(in_register_00000034,__fd);
  local_20 = this;
  rawMessage_local._M_len = (size_t)__buf;
  this_00 = std::unique_ptr<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>::operator->
                      (&this->m_socket);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_70,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_71);
  std::operator+(&local_50,&local_70,"\r\n");
  local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  Socket::send(this_00,(int)local_30._M_len,local_30._M_str,__n,__flags);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  sVar1 = std::allocator<char>::~allocator(&local_71);
  return sVar1;
}

Assistant:

void Jupiter::IRC::Client::send(std::string_view rawMessage) {
	m_socket->send(static_cast<std::string>(rawMessage) + "\r\n");
}